

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O3

MidiEvent * __thiscall smf::MidiEvent::operator=(MidiEvent *this,MidiEvent *mfevent)

{
  int iVar1;
  pointer puVar2;
  long lVar3;
  
  if (this != mfevent) {
    iVar1 = mfevent->track;
    this->tick = mfevent->tick;
    this->track = iVar1;
    this->seconds = mfevent->seconds;
    this->seq = mfevent->seq;
    this->m_eventlink = (MidiEvent *)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (long)(mfevent->super_MidiMessage).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(mfevent->super_MidiMessage).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    puVar2 = (this->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < *(int *)&(this->super_MidiMessage).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (int)puVar2) {
      lVar3 = 0;
      do {
        puVar2[lVar3] =
             (mfevent->super_MidiMessage).
             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[lVar3];
        lVar3 = lVar3 + 1;
        puVar2 = (this->super_MidiMessage).
                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (lVar3 < *(int *)&(this->super_MidiMessage).
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (int)puVar2);
    }
  }
  return this;
}

Assistant:

MidiEvent& MidiEvent::operator=(const MidiEvent& mfevent) {
	if (this == &mfevent) {
		return *this;
	}
	tick    = mfevent.tick;
	track   = mfevent.track;
	seconds = mfevent.seconds;
	seq     = mfevent.seq;
	m_eventlink = NULL;
	this->resize(mfevent.size());
	for (int i=0; i<(int)this->size(); i++) {
		(*this)[i] = mfevent[i];
	}
	return *this;
}